

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

bool __thiscall matchit::impl::Id<int>::matchValue<int_const&>(Id<int> *this,int *v)

{
  bool bVar1;
  IdBlock<int> *pIVar2;
  int *piVar3;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_1d;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1179:45)>
  local_1c;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_1b;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
  local_1a;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_19;
  
  pIVar2 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [*(__index_type *)
               ((long)&(this->mBlock).
                       super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
               + 0x18)]._M_data)(&local_1d,&this->mBlock);
  bVar1 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1173:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1175:45),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1179:45)>_&&,_const_std::variant<std::monostate,_int,_int_*,_const_int_*>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pIVar2->super_IdBlockBase<int>).mVariant.
                      super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
                      super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
                      super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*> + 8)].
            _M_data)(&local_1c,&(pIVar2->super_IdBlockBase<int>).mVariant);
  if (bVar1) {
    pIVar2 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
               ::_S_vtable._M_arr
               [*(__index_type *)
                 ((long)&(this->mBlock).
                         super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                 + 0x18)]._M_data)(&local_1b,&this->mBlock);
    piVar3 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_int_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_int,_int_*,_const_int_*>_&>
               ::_S_vtable._M_arr
               [*(__index_type *)
                 ((long)&(pIVar2->super_IdBlockBase<int>).mVariant.
                         super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
                         super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*> + 8)].
               _M_data)(&local_1a,&(pIVar2->super_IdBlockBase<int>).mVariant);
    bVar1 = *piVar3 == *v;
  }
  else {
    pIVar2 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
               ::_S_vtable._M_arr
               [*(__index_type *)
                 ((long)&(this->mBlock).
                         super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                 + 0x18)]._M_data)(&local_19,&this->mBlock);
    *(int **)&(pIVar2->super_IdBlockBase<int>).mVariant.
              super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
              super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
              super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
              super__Move_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
              super__Copy_ctor_alias<std::monostate,_int,_int_*,_const_int_*> = v;
    *(__index_type *)
     ((long)&(pIVar2->super_IdBlockBase<int>).mVariant.
             super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
             super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
             super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*> + 8) = '\x03';
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }